

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

DescriptorPool * google::protobuf::DescriptorPool::internal_generated_pool(void)

{
  int iVar1;
  DescriptorPool *arg;
  
  if (internal_generated_pool()::generated_pool == '\0') {
    iVar1 = __cxa_guard_acquire(&internal_generated_pool()::generated_pool);
    if (iVar1 != 0) {
      arg = anon_unknown_24::NewGeneratedPool();
      internal::OnShutdownRun
                (internal::OnShutdownDelete<google::protobuf::DescriptorPool>::
                 anon_class_1_0_00000001::__invoke,arg);
      internal_generated_pool::generated_pool = arg;
      __cxa_guard_release(&internal_generated_pool()::generated_pool);
    }
  }
  return internal_generated_pool::generated_pool;
}

Assistant:

DescriptorPool* DescriptorPool::internal_generated_pool() {
  static DescriptorPool* generated_pool =
      internal::OnShutdownDelete(NewGeneratedPool());
  return generated_pool;
}